

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

shared_ptr<pbrt::syntactic::Texture> __thiscall
pbrt::syntactic::Attributes::findNamedItem<std::shared_ptr<pbrt::syntactic::Texture>>
          (Attributes *this,shared_ptr<pbrt::syntactic::Texture> *item,string *name)

{
  bool bVar1;
  string *name_00;
  element_type *peVar2;
  string *in_RCX;
  Attributes *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Attributes *in_RSI;
  element_type *in_RDI;
  shared_ptr<pbrt::syntactic::Texture> sVar4;
  iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Texture>_>_>_>
  *items;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Texture>_>_>_>
  *in_stack_ffffffffffffff38;
  string local_88 [48];
  _Self local_58;
  _Self local_50 [3];
  shared_ptr<pbrt::syntactic::Texture> local_38;
  string *item_00;
  
  item_00 = in_RCX;
  std::shared_ptr<pbrt::syntactic::Texture>::shared_ptr
            ((shared_ptr<pbrt::syntactic::Texture> *)0x1bedad);
  name_00 = (string *)get_abi_cxx11_(in_RSI,&local_38);
  std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::Texture> *)0x1bedd0);
  local_50[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Texture>_>_>_>
       ::find(in_stack_ffffffffffffff38,(key_type *)0x1bedef);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Texture>_>_>_>
       ::end(in_stack_ffffffffffffff38);
  bVar1 = std::operator!=(local_50,&local_58);
  if (bVar1) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Texture>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Texture>_>_>
                  *)0x1bee25);
    std::shared_ptr<pbrt::syntactic::Texture>::shared_ptr
              ((shared_ptr<pbrt::syntactic::Texture> *)in_RCX,
               (shared_ptr<pbrt::syntactic::Texture> *)in_stack_ffffffffffffff38);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RSI->parent);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1bee86);
      std::shared_ptr<pbrt::syntactic::Texture>::shared_ptr
                ((shared_ptr<pbrt::syntactic::Texture> *)in_RCX,
                 (shared_ptr<pbrt::syntactic::Texture> *)peVar2);
      std::__cxx11::string::string(local_88,in_RCX);
      findNamedItem<std::shared_ptr<pbrt::syntactic::Texture>>
                (in_RDX,(shared_ptr<pbrt::syntactic::Texture> *)item_00,name_00);
      std::__cxx11::string::~string(local_88);
      std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
                ((shared_ptr<pbrt::syntactic::Texture> *)0x1beed8);
      _Var3._M_pi = extraout_RDX_00;
    }
    else {
      std::shared_ptr<pbrt::syntactic::Texture>::shared_ptr
                ((shared_ptr<pbrt::syntactic::Texture> *)in_RCX,in_stack_ffffffffffffff38);
      _Var3._M_pi = extraout_RDX_01;
    }
  }
  sVar4.super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<pbrt::syntactic::Texture>)
         sVar4.super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Item findNamedItem(Item item, std::string name) {
        auto &items = get(Item{});
        auto it = items.find(name);
        if (it != items.end()) return it->second;
        if (parent) return parent->findNamedItem(item,name);
        return nullptr;
      }